

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O0

void __thiscall
QHttpNetworkReplyPrivate::QHttpNetworkReplyPrivate(QHttpNetworkReplyPrivate *this,QUrl *newUrl)

{
  bool bVar1;
  bool bVar2;
  QUrl *in_RSI;
  QHttpNetworkRequest *in_RDI;
  long in_FS_OFFSET;
  QString scheme;
  QUrl *in_stack_ffffffffffffff88;
  QSharedDataPointer<QHttpNetworkRequestPrivate> *pQVar3;
  QHttpNetworkHeaderPrivate *in_stack_ffffffffffffff90;
  QByteDataBuffer *this_00;
  Priority in_stack_ffffffffffffffa0;
  Operation in_stack_ffffffffffffffa4;
  QHttpNetworkRequest *this_01;
  QUrl local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  QObjectPrivate::QObjectPrivate((QObjectPrivate *)in_RDI,QObjectPrivateVersion);
  QHttpNetworkHeaderPrivate::QHttpNetworkHeaderPrivate
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  (in_RDI->super_QHttpNetworkHeader)._vptr_QHttpNetworkHeader =
       (_func_int **)&PTR__QHttpNetworkReplyPrivate_0049e330;
  *(undefined4 *)&in_RDI[0xd].super_QHttpNetworkHeader._vptr_QHttpNetworkHeader = 0;
  pQVar3 = &in_RDI[0xd].d;
  QUrl::QUrl(&local_10);
  QHttpNetworkRequest::QHttpNetworkRequest
            (this_01,in_RSI,in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0);
  QUrl::~QUrl(&local_10);
  *(undefined1 *)&in_RDI[0xe].d.d.ptr = 0;
  QString::QString((QString *)0x304c8f);
  in_RDI[0x10].d.d.ptr = (QHttpNetworkRequestPrivate *)0x0;
  in_RDI[0x11].super_QHttpNetworkHeader._vptr_QHttpNetworkHeader = (_func_int **)0x0;
  in_RDI[0x11].d.d.ptr = (QHttpNetworkRequestPrivate *)0x0;
  QByteArray::QByteArray((QByteArray *)0x304cc1);
  *(undefined1 *)&in_RDI[0x13].d.d.ptr = 0;
  *(undefined1 *)((long)&in_RDI[0x13].d.d.ptr + 1) = 1;
  *(undefined1 *)((long)&in_RDI[0x13].d.d.ptr + 2) = 0;
  *(undefined1 *)((long)&in_RDI[0x13].d.d.ptr + 3) = 0;
  in_RDI[0x14].super_QHttpNetworkHeader._vptr_QHttpNetworkHeader = (_func_int **)0x0;
  in_RDI[0x14].d.d.ptr = (QHttpNetworkRequestPrivate *)0x0;
  in_RDI[0x15].super_QHttpNetworkHeader._vptr_QHttpNetworkHeader = (_func_int **)0x0;
  in_RDI[0x15].d.d.ptr = (QHttpNetworkRequestPrivate *)0x0;
  in_RDI[0x16].super_QHttpNetworkHeader._vptr_QHttpNetworkHeader = (_func_int **)0xffffffffffffffff;
  QPointer<QHttpNetworkConnection>::QPointer
            ((QPointer<QHttpNetworkConnection> *)in_stack_ffffffffffffff90,pQVar3);
  QPointer<QHttpNetworkConnectionChannel>::QPointer
            ((QPointer<QHttpNetworkConnectionChannel> *)0x304d3a);
  *(undefined4 *)&in_RDI[0x18].d.d.ptr = 0;
  *(undefined1 *)((long)&in_RDI[0x18].d.d.ptr + 4) = 0;
  this_00 = (QByteDataBuffer *)(in_RDI + 0x19);
  memset(this_00,0,0x28);
  QByteDataBuffer::QByteDataBuffer(this_00);
  *(undefined1 *)&in_RDI[0x1b].d.d.ptr = 0;
  *(undefined1 *)((long)&in_RDI[0x1b].d.d.ptr + 1) = 0;
  *(undefined1 *)((long)&in_RDI[0x1b].d.d.ptr + 2) = 0;
  *(undefined1 *)((long)&in_RDI[0x1b].d.d.ptr + 3) = 0;
  in_RDI[0x1c].super_QHttpNetworkHeader._vptr_QHttpNetworkHeader = (_func_int **)0x0;
  QUrl::QUrl((QUrl *)&in_RDI[0x1c].d);
  QUrl::scheme();
  Qt::Literals::StringLiterals::operator____L1((char *)in_RDI,(size_t)this_00);
  bVar1 = ::operator==((QString *)in_RDI,(QLatin1StringView *)this_00);
  bVar2 = true;
  if (!bVar1) {
    Qt::Literals::StringLiterals::operator____L1((char *)in_RDI,(size_t)this_00);
    bVar2 = ::operator==((QString *)in_RDI,(QLatin1StringView *)this_00);
  }
  if (bVar2 != false) {
    *(undefined1 *)((long)&in_RDI[0x13].d.d.ptr + 1) = 0;
  }
  QString::~QString((QString *)0x304e62);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QHttpNetworkReplyPrivate::QHttpNetworkReplyPrivate(const QUrl &newUrl)
    : QHttpNetworkHeaderPrivate(newUrl)
    , state(NothingDoneState)
    , ssl(false),
      bodyLength(0), contentRead(0), totalProgress(0),
      chunkedTransferEncoding(false),
      connectionCloseEnabled(true),
      forceConnectionCloseEnabled(false),
      lastChunkRead(false),
      currentChunkSize(0), currentChunkRead(0), readBufferMaxSize(0),
      totallyUploadedData(0),
      removedContentLength(-1),
      connection(nullptr),
      autoDecompress(false), responseData(), requestIsPrepared(false)
      ,pipeliningUsed(false), h2Used(false), downstreamLimited(false)
      ,userProvidedDownloadBuffer(nullptr)

{
    QString scheme = newUrl.scheme();
    if (scheme == "preconnect-http"_L1 || scheme == "preconnect-https"_L1)
        // make sure we do not close the socket after preconnecting
        connectionCloseEnabled = false;
}